

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int __thiscall AActor::SpawnHealth(AActor *this)

{
  int iVar1;
  int iVar2;
  AActor *pAVar3;
  double dVar4;
  
  iVar1 = this->StartHealth;
  if (iVar1 == 0) {
    pAVar3 = GetDefault(this);
    iVar1 = pAVar3->health;
  }
  iVar2 = iVar1;
  if (iVar1 != 0 && ((this->flags3).Value & 0x2000) != 0) {
    dVar4 = G_SkillProperty((((this->flags).Value >> 0x1b & 1) != 0) + SKILLP_MonsterHealth);
    iVar2 = 1;
    if (1 < (int)(dVar4 * (double)iVar1)) {
      iVar2 = (int)(dVar4 * (double)iVar1);
    }
  }
  return iVar2;
}

Assistant:

int AActor::SpawnHealth() const
{
	int defhealth = StartHealth ? StartHealth : GetDefault()->health;
	if (!(flags3 & MF3_ISMONSTER) || defhealth == 0)
	{
		return defhealth;
	}
	else if (flags & MF_FRIENDLY)
	{
		int adj = int(defhealth * G_SkillProperty(SKILLP_FriendlyHealth));
		return (adj <= 0) ? 1 : adj;
	}
	else
	{
		int adj = int(defhealth * G_SkillProperty(SKILLP_MonsterHealth));
		return (adj <= 0) ? 1 : adj;
	}
}